

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::is_chunked_transfer_encoding(Headers *headers)

{
  byte *pbVar1;
  byte *pbVar2;
  char *__s;
  long lVar3;
  bool bVar4;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>_>
  pVar5;
  allocator<char> local_79;
  byte *local_78;
  long local_70;
  long local_68 [2];
  byte *local_58;
  long local_50;
  long local_48 [2];
  key_type local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Transfer-Encoding","");
  pVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_httplib::detail::case_ignore::equal_to,_httplib::detail::case_ignore::hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
          ::equal_range(&headers->_M_h,&local_38);
  if ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
       )pVar5.first.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur ==
      pVar5.second.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
     ) {
    __s = "";
  }
  else {
    __s = *(char **)((long)&(((__node_type *)
                             pVar5.first.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                             ._M_cur)->
                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_storage._M_storage + 0x20);
  }
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,__s,&local_79);
  local_58 = (byte *)local_48;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"chunked","");
  if (local_70 == local_50) {
    bVar4 = local_70 == 0;
    if (bVar4) goto LAB_00173f66;
    if (case_ignore::to_lower(int)::table[*local_78] == case_ignore::to_lower(int)::table[*local_58]
       ) {
      lVar3 = 1;
      do {
        bVar4 = local_70 == lVar3;
        if (bVar4) goto LAB_00173f66;
        pbVar1 = local_78 + lVar3;
        pbVar2 = local_58 + lVar3;
        lVar3 = lVar3 + 1;
      } while (case_ignore::to_lower(int)::table[*pbVar1] ==
               case_ignore::to_lower(int)::table[*pbVar2]);
    }
  }
  bVar4 = false;
LAB_00173f66:
  if (local_58 != (byte *)local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_78 != (byte *)local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

inline bool is_chunked_transfer_encoding(const Headers &headers) {
  return case_ignore::equal(
      get_header_value(headers, "Transfer-Encoding", "", 0), "chunked");
}